

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O3

iterator __thiscall
efsw::DirectorySnapshot::nodeInFiles_abi_cxx11_(DirectorySnapshot *this,FileInfo *fi)

{
  _Base_ptr __n;
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp;
  
  bVar1 = FileInfo::inodeSupported();
  if (bVar1) {
    for (p_Var3 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Files)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      bVar1 = FileInfo::sameInode((FileInfo *)(p_Var3 + 2),fi);
      if (bVar1) {
        __n = p_Var3[2]._M_parent;
        if (__n != (_Base_ptr)(fi->Filepath)._M_string_length) {
          return (iterator)p_Var3;
        }
        if ((__n != (_Base_ptr)0x0) &&
           (iVar2 = bcmp((((FileInfo *)(p_Var3 + 2))->Filepath)._M_dataplus._M_p,
                         (fi->Filepath)._M_dataplus._M_p,(size_t)__n), iVar2 != 0)) {
          return (iterator)p_Var3;
        }
      }
    }
  }
  return (iterator)&(this->Files)._M_t._M_impl.super__Rb_tree_header._M_header;
}

Assistant:

FileInfoMap::iterator DirectorySnapshot::nodeInFiles( FileInfo& fi ) {
	FileInfoMap::iterator it;

	if ( FileInfo::inodeSupported() ) {
		for ( it = Files.begin(); it != Files.end(); it++ ) {
			if ( it->second.sameInode( fi ) && it->second.Filepath != fi.Filepath ) {
				return it;
			}
		}
	}

	return Files.end();
}